

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void LodePNGText_cleanup(LodePNGInfo *info)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = 0;
  for (sVar2 = 0; sVar2 != info->text_num; sVar2 = sVar2 + 1) {
    string_cleanup((char **)((long)info->text_keys + lVar1));
    string_cleanup((char **)((long)info->text_strings + lVar1));
    lVar1 = lVar1 + 8;
  }
  free(info->text_keys);
  free(info->text_strings);
  return;
}

Assistant:

static void LodePNGText_cleanup(LodePNGInfo* info)
{
	size_t i;
	for (i = 0; i != info->text_num; ++i)
	{
		string_cleanup(&info->text_keys[i]);
		string_cleanup(&info->text_strings[i]);
	}
	lodepng_free(info->text_keys);
	lodepng_free(info->text_strings);
}